

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::Clear
          (SmallHeapBlockAllocator<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  size_t *psVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  Recycler *this_00;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar7;
  FreeObject *pFVar8;
  
  pSVar7 = &this->heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
  if (pSVar7 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    pFVar8 = this->freeObjectList;
    if (pFVar8 != (FreeObject *)0x0) {
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (; pFVar8 != (FreeObject *)0x0; pFVar8 = FreeObject::GetNext(pFVar8)) {
        this_00 = HeapBucket::GetRecycler(this->bucket);
        pSVar7 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                 Recycler::FindHeapBlock(this_00,pFVar8);
        if (pSVar7 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x83,"(heapBlockVerify != nullptr)","heapBlockVerify != nullptr");
          if (!bVar3) goto LAB_006a621c;
          *puVar6 = 0;
        }
        if ((pSVar7->super_HeapBlock).heapBlockType == LargeBlockType) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                             ,0x84,"(!heapBlockVerify->IsLargeHeapBlock())",
                             "!heapBlockVerify->IsLargeHeapBlock()");
          if (!bVar3) goto LAB_006a621c;
          *puVar6 = 0;
        }
        SmallHeapBlockT<SmallAllocationBlockAttributes>::ClearExplicitFreeBitForObject
                  (pSVar7,pFVar8);
      }
      this->freeObjectList = (FreeObject *)0x0;
    }
    return;
  }
  if (pSVar7->isInAllocator == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x3c,"(heapBlock->isInAllocator)","heapBlock->isInAllocator");
    if (!bVar3) goto LAB_006a621c;
    *puVar6 = 0;
  }
  pSVar7->isInAllocator = false;
  if (this->endAddress == (char *)0x0) {
    pFVar8 = this->freeObjectList;
    pSVar7->freeObjectList = pFVar8;
    this->freeObjectList = (FreeObject *)0x0;
    if (pFVar8 != (FreeObject *)0x0) {
      SmallHeapBlockT<SmallAllocationBlockAttributes>::SetIsClearedFromAllocator(pSVar7,true);
      goto LAB_006a61eb;
    }
  }
  else {
    TrackNativeAllocatedObjects(this);
    this->lastNonNativeBumpAllocatedBlock = (char *)0x0;
    Recycler::TrackUnallocated
              (this->bucket->heapInfo->recycler,(char *)this->freeObjectList,this->endAddress,
               (ulong)this->bucket->sizeCat);
    RecyclerMemoryTracking::ReportUnallocated
              (((this->heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket)
               ->heapInfo->recycler,this->freeObjectList,this->endAddress,
               (ulong)pSVar7->heapBucket->sizeCat);
    if (pSVar7->freeObjectList != (FreeObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                         ,0x54,"(heapBlock->freeObjectList == nullptr)",
                         "heapBlock->freeObjectList == nullptr");
      if (!bVar3) goto LAB_006a621c;
      *puVar6 = 0;
    }
    this->endAddress = (char *)0x0;
    this->freeObjectList = (FreeObject *)0x0;
  }
  uVar4 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAndClearLastFreeCount(pSVar7);
  uVar5 = pSVar7->objectSize * uVar4;
  psVar1 = &(pSVar7->heapBucket->heapInfo->recycler->autoHeap).uncollectedAllocBytes;
  *psVar1 = *psVar1 + (ulong)uVar5;
  if (pSVar7->lastUncollectedAllocBytes != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x6f,"(heapBlock->lastUncollectedAllocBytes == 0)",
                       "heapBlock->lastUncollectedAllocBytes == 0");
    if (!bVar3) {
LAB_006a621c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar5 = uVar4 * pSVar7->objectSize;
  }
  pSVar7->lastUncollectedAllocBytes = uVar5;
LAB_006a61eb:
  this->heapBlock = (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  SmallHeapBlockT<SmallAllocationBlockAttributes>::CheckDebugFreeBitVector(pSVar7,false);
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::Clear()
{
    TBlockType * heapBlock = this->heapBlock;
    if (heapBlock != nullptr)
    {
        Assert(heapBlock->isInAllocator);
        heapBlock->isInAllocator = false;
        FreeObject * remainingFreeObjectList = nullptr;
        if (this->endAddress != nullptr)
        {
#ifdef RECYCLER_TRACK_NATIVE_ALLOCATED_OBJECTS
            TrackNativeAllocatedObjects();
            lastNonNativeBumpAllocatedBlock = nullptr;
#endif
#ifdef PROFILE_RECYCLER_ALLOC
            // Need to tell the tracker
            this->bucket->heapInfo->recycler->TrackUnallocated((char *)this->freeObjectList, this->endAddress, this->bucket->sizeCat);
#endif
            RecyclerMemoryTracking::ReportUnallocated(this->heapBlock->heapBucket->heapInfo->recycler, (char *)this->freeObjectList, this->endAddress, heapBlock->heapBucket->sizeCat);
#ifdef RECYCLER_PERF_COUNTERS
            size_t unallocatedObjects = heapBlock->objectCount - ((char *)this->freeObjectList - heapBlock->address) / heapBlock->objectSize;
            size_t unallocatedObjectBytes = unallocatedObjects * heapBlock->GetObjectSize();
            RECYCLER_PERF_COUNTER_ADD(LiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, unallocatedObjects);
            RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, unallocatedObjectBytes);
            RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, unallocatedObjectBytes);
#endif
            Assert(heapBlock->freeObjectList == nullptr);
            this->endAddress = nullptr;
        }
        else
        {
            remainingFreeObjectList = this->freeObjectList;
            heapBlock->freeObjectList = remainingFreeObjectList;
        }
        this->freeObjectList = nullptr;

        // this->freeObjectList and this->lastFreeCount are accessed in SmallHeapBlock::ResetMarks
        // the order of access there is first we see if lastFreeCount = 0, and if it is, we assert
        // that freeObjectList = null. Because of ARM's memory model, we need to insert barriers
        // so that the two variables can be accessed correctly across threads. Here, after we write
        // to this->freeObjectList, we insert a write barrier so that if this->lastFreeCount is 0,
        // this->freeObjectList must have been set to null. On the other end, we stick a read barrier
        // We use the MemoryBarrier macro because of ARMs lack of a separate read barrier
#if defined(_M_ARM32_OR_ARM64)
#if DBG
        MemoryBarrier();
#endif
#endif

        if (remainingFreeObjectList == nullptr)
        {
            uint lastFreeCount = heapBlock->GetAndClearLastFreeCount();
            heapBlock->heapBucket->heapInfo->recycler->autoHeap.uncollectedAllocBytes += lastFreeCount * heapBlock->GetObjectSize();
            Assert(heapBlock->lastUncollectedAllocBytes == 0);
            DebugOnly(heapBlock->lastUncollectedAllocBytes = lastFreeCount * heapBlock->GetObjectSize());
        }
        else
        {
            DebugOnly(heapBlock->SetIsClearedFromAllocator(true));
        }
        this->heapBlock = nullptr;

        RECYCLER_SLOW_CHECK(heapBlock->CheckDebugFreeBitVector(false));
    }
    else if (this->freeObjectList != nullptr)
    {
        // Explicit Free Object List
#ifdef RECYCLER_MEMORY_VERIFY
        FreeObject* freeObject = this->freeObjectList;

        while (freeObject)
        {
            HeapBlock* heapBlockVerify = this->bucket->GetRecycler()->FindHeapBlock((void*) freeObject);
            Assert(heapBlockVerify != nullptr);
            Assert(!heapBlockVerify->IsLargeHeapBlock());
            TBlockType* smallBlock = (TBlockType*)heapBlockVerify;

            smallBlock->ClearExplicitFreeBitForObject((void*) freeObject);
            freeObject = freeObject->GetNext();
        }
#endif
        this->freeObjectList = nullptr;
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = false);
#endif
}